

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env.cpp
# Opt level: O2

u32 GF2::Env::Ticks(void)

{
  timespec ts;
  
  clock_gettime(1,(timespec *)&ts);
  return (int)(ts.tv_nsec / 1000000) + (int)ts.tv_sec * 1000;
}

Assistant:

u32 Env::Ticks()
{
	u32 ticks = 0;
#if defined OS_WIN
	ticks = (u32)::GetTickCount();
#elif defined OS_LINUX
	timespec ts;
    ::clock_gettime(CLOCK_MONOTONIC, &ts);
    ticks = ts.tv_nsec / 1000000;
    ticks += ts.tv_sec * 1000;
#elif defined OS_APPLE
	clock_serv_t cclock;
	mach_timespec_t mts;
	host_get_clock_service(mach_host_self(), CALENDAR_CLOCK, &cclock);
	clock_get_time(cclock, &mts);
	mach_port_deallocate(mach_task_self(), cclock);
    ticks = mts.tv_nsec / 1000000;
    ticks += mts.tv_sec * 1000;
#endif
	return ticks;
}